

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> __thiscall
flow::lang::Parser::decl(Parser *this)

{
  int iVar1;
  undefined8 in_RAX;
  bool in_SIL;
  undefined7 in_register_00000031;
  undefined8 local_18;
  
  iVar1 = *(int *)(*(long *)(CONCAT71(in_register_00000031,in_SIL) + 0x30) + 0xa0);
  local_18 = in_RAX;
  if ((iVar1 == 0x48) || (iVar1 == 0x39)) {
    handlerDecl((Parser *)&stack0xffffffffffffffe8,in_SIL);
  }
  else {
    if (iVar1 != 0x37) {
      *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
      return (__uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true>
              )(__uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true>
                )this;
    }
    varDecl((Parser *)&stack0xffffffffffffffe8);
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = local_18;
  return (__uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Symbol> Parser::decl() {
  switch (token()) {
    case Token::Var:
      return varDecl();
    case Token::Handler:
      return handlerDecl(true);
    case Token::Ident:
      return handlerDecl(false);
    default:
      return nullptr;
  }
}